

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  unsigned_short *puVar3;
  undefined1 auVar4 [16];
  ImWchar IVar5;
  int iVar6;
  ImWchar *pIVar7;
  ImWchar *in_text;
  long lVar8;
  undefined1 auVar9 [16];
  
  lVar8 = (long)pos;
  in_text = (obj->TextW).Data + lVar8;
  iVar6 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  uVar1 = obj->CurLenW;
  uVar2 = obj->CurLenA;
  auVar9._4_4_ = uVar2;
  auVar9._0_4_ = uVar1;
  auVar4 = vpinsrd_avx(ZEXT416((uint)n),iVar6,1);
  auVar9._8_8_ = 0;
  auVar4 = vpsubd_avx(auVar9,auVar4);
  obj->CurLenW = (int)auVar4._0_8_;
  obj->CurLenA = (int)((ulong)auVar4._0_8_ >> 0x20);
  puVar3 = (obj->TextW).Data;
  IVar5 = puVar3[lVar8 + n];
  if (IVar5 != 0) {
    pIVar7 = puVar3 + (long)n + lVar8 + 1;
    do {
      *in_text = IVar5;
      in_text = in_text + 1;
      IVar5 = *pIVar7;
      pIVar7 = pIVar7 + 1;
    } while (IVar5 != 0);
  }
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}